

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O2

int cmd_crc32(char *args)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  int iVar9;
  char *pcVar10;
  bool bVar11;
  PHYSFS_uint8 buffer [512];
  
  pcVar10 = args;
  if (*args == '\"') {
    pcVar10 = args + 1;
    sVar1 = strlen(pcVar10);
    args[sVar1] = '\0';
  }
  lVar2 = PHYSFS_openRead(pcVar10);
  if (lVar2 == 0) {
    uVar4 = PHYSFS_getLastError();
    pcVar10 = "failed to open. Reason: [%s].\n";
  }
  else {
    uVar8 = 0xffffffffffffffff;
    while( true ) {
      lVar3 = PHYSFS_readBytes(lVar2,buffer,0x200);
      if (lVar3 < 1) break;
      for (uVar5 = 0; uVar6 = (ulong)uVar5, (long)uVar6 < lVar3; uVar5 = uVar5 + 1) {
        bVar7 = buffer[uVar6];
        iVar9 = 8;
        while (bVar11 = iVar9 != 0, iVar9 = iVar9 + -1, bVar11) {
          uVar8 = (ulong)(-(((uint)uVar8 ^ (uint)bVar7) & 1) & 0xedb88320 ^
                         (uint)(uVar8 >> 1) & 0x7fffffff);
          bVar7 = bVar7 >> 1;
        }
        buffer[uVar6] = bVar7;
      }
    }
    if (-1 < lVar3) {
      PHYSFS_close(lVar2);
      printf("CRC32 for %s: 0x%08X\n",pcVar10,(ulong)~(uint)uVar8);
      return 1;
    }
    uVar4 = PHYSFS_getLastError();
    pcVar10 = "error while reading. Reason: [%s].\n";
  }
  printf(pcVar10,uVar4);
  return 1;
}

Assistant:

static int cmd_crc32(char *args)
{
    PHYSFS_File *f;

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    f = PHYSFS_openRead(args);
    if (f == NULL)
        printf("failed to open. Reason: [%s].\n", PHYSFS_getLastError());
    else
    {
        PHYSFS_uint8 buffer[CRC32_BUFFERSIZE];
        PHYSFS_uint32 crc = -1;
        PHYSFS_sint64 bytesread;

        while ((bytesread = PHYSFS_readBytes(f, buffer, CRC32_BUFFERSIZE)) > 0)
        {
            PHYSFS_uint32 i, bit;
            for (i = 0; i < bytesread; i++)
            {
                for (bit = 0; bit < 8; bit++, buffer[i] >>= 1)
                    crc = (crc >> 1) ^ (((crc ^ buffer[i]) & 1) ? 0xEDB88320 : 0);
            } /* for */
        } /* while */

        if (bytesread < 0)
        {
            printf("error while reading. Reason: [%s].\n",
                   PHYSFS_getLastError());
            return 1;
        } /* if */

        PHYSFS_close(f);

        crc ^= -1;
        printf("CRC32 for %s: 0x%08X\n", args, crc);
    } /* else */

    return 1;
}